

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_render.cpp
# Opt level: O2

void __thiscall TexturesOnViewportEdge::check(TexturesOnViewportEdge *this)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  char *pcVar4;
  int y;
  int y_00;
  uint uVar5;
  uint x;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  vec4 vVar6;
  vec4 v;
  vec4 v_00;
  vec4 b;
  vec4 b_00;
  vec4 b_01;
  
  (*((this->super_StaticRenderTest).m_surface)->m_impl->_vptr_SurfaceBackendImpl[6])();
  if ((this->super_StaticRenderTest).m_w < 1) {
    pcVar4 = "0 < m_w";
  }
  else if ((this->super_StaticRenderTest).m_h < 1) {
    pcVar4 = "0 < m_h";
  }
  else {
    vVar6 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,0);
    b.z = 0.0;
    b.w = 1.0;
    b.x = 0.5;
    b.y = 0.0;
    bVar1 = rengine::fuzzy_equals(vVar6,b,0.01);
    if (bVar1) {
      if ((this->super_StaticRenderTest).m_w < 2) {
        pcVar4 = "1 < m_w";
      }
      else if ((this->super_StaticRenderTest).m_h < 1) {
        pcVar4 = "0 < m_h";
      }
      else {
        vVar6 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,0);
        bVar1 = rengine::fuzzy_equals(vVar6,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
        if (bVar1) {
          if ((this->super_StaticRenderTest).m_w < 2) {
            pcVar4 = "1 < m_w";
          }
          else if ((this->super_StaticRenderTest).m_h < 2) {
            pcVar4 = "1 < m_h";
          }
          else {
            vVar6 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,1);
            bVar1 = rengine::fuzzy_equals(vVar6,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
            if (bVar1) {
              if ((this->super_StaticRenderTest).m_w < 1) {
                pcVar4 = "0 < m_w";
              }
              else if ((this->super_StaticRenderTest).m_h < 2) {
                pcVar4 = "1 < m_h";
              }
              else {
                vVar6 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,1);
                bVar1 = rengine::fuzzy_equals
                                  (vVar6,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01);
                if (bVar1) {
                  uVar5 = (uint)(extraout_XMM0_Da + -1.0);
                  if ((int)uVar5 < 0) {
                    pcVar4 = "r >= 0";
                  }
                  else if ((int)uVar5 < (this->super_StaticRenderTest).m_w) {
                    if ((this->super_StaticRenderTest).m_h < 1) {
                      pcVar4 = "0 < m_h";
                    }
                    else {
                      vVar6 = rengine::StaticRenderTest::pixel
                                        (&this->super_StaticRenderTest,uVar5,0);
                      b_00.z = 0.0;
                      b_00.w = 1.0;
                      b_00.x = 0.0;
                      b_00.y = 0.25;
                      bVar1 = rengine::fuzzy_equals(vVar6,b_00,0.01);
                      if (bVar1) {
                        x = uVar5 - 1;
                        if (uVar5 == 0) {
                          pcVar4 = "r-1 >= 0";
                        }
                        else if ((this->super_StaticRenderTest).m_w < (int)uVar5) {
                          pcVar4 = "r-1 < m_w";
                        }
                        else if ((this->super_StaticRenderTest).m_h < 1) {
                          pcVar4 = "0 < m_h";
                        }
                        else {
                          vVar6 = rengine::StaticRenderTest::pixel
                                            (&this->super_StaticRenderTest,x,0);
                          bVar1 = rengine::fuzzy_equals
                                            (vVar6,(vec4)(ZEXT816(0x3f80000000000000) << 0x40),0.01)
                          ;
                          if (bVar1) {
                            if ((int)uVar5 < (this->super_StaticRenderTest).m_w) {
                              if ((this->super_StaticRenderTest).m_h < 2) {
                                pcVar4 = "1 < m_h";
                              }
                              else {
                                vVar6 = rengine::StaticRenderTest::pixel
                                                  (&this->super_StaticRenderTest,uVar5,1);
                                bVar1 = rengine::fuzzy_equals
                                                  (vVar6,(vec4)(ZEXT816(0x3f80000000000000) << 0x40)
                                                   ,0.01);
                                if (bVar1) {
                                  if ((this->super_StaticRenderTest).m_w < (int)uVar5) {
                                    pcVar4 = "r-1 < m_w";
                                  }
                                  else if ((this->super_StaticRenderTest).m_h < 2) {
                                    pcVar4 = "1 < m_h";
                                  }
                                  else {
                                    vVar6 = rengine::StaticRenderTest::pixel
                                                      (&this->super_StaticRenderTest,x,1);
                                    bVar1 = rengine::fuzzy_equals
                                                      (vVar6,(vec4)(ZEXT816(0x3f80000000000000) <<
                                                                   0x40),0.01);
                                    if (bVar1) {
                                      if ((this->super_StaticRenderTest).m_w < 1) {
                                        pcVar4 = "0 < m_w";
                                      }
                                      else {
                                        y = (int)(extraout_XMM0_Db + -1.0);
                                        if (y < 0) {
                                          pcVar4 = "b >= 0";
                                        }
                                        else if (y < (this->super_StaticRenderTest).m_h) {
                                          vVar6 = rengine::StaticRenderTest::pixel
                                                            (&this->super_StaticRenderTest,0,y);
                                          bVar1 = rengine::fuzzy_equals
                                                            (vVar6,(vec4)(ZEXT816(0x3f8000003f400000
                                                                                 ) << 0x40),0.01);
                                          if (bVar1) {
                                            if ((this->super_StaticRenderTest).m_w < 2) {
                                              pcVar4 = "1 < m_w";
                                            }
                                            else if (y < (this->super_StaticRenderTest).m_h) {
                                              vVar6 = rengine::StaticRenderTest::pixel
                                                                (&this->super_StaticRenderTest,1,y);
                                              bVar1 = rengine::fuzzy_equals
                                                                (vVar6,(vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40),0.01);
                                              if (bVar1) {
                                                if ((this->super_StaticRenderTest).m_w < 1) {
                                                  pcVar4 = "0 < m_w";
                                                }
                                                else {
                                                  y_00 = y + -1;
                                                  if (y == 0) {
                                                    pcVar4 = "b-1 >= 0";
                                                  }
                                                  else if ((this->super_StaticRenderTest).m_h < y) {
                                                    pcVar4 = "b-1 < m_h";
                                                  }
                                                  else {
                                                    vVar6 = rengine::StaticRenderTest::pixel
                                                                      (&this->super_StaticRenderTest
                                                                       ,0,y_00);
                                                    bVar1 = rengine::fuzzy_equals
                                                                      (vVar6,(vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40),0.01);
                                                  if (bVar1) {
                                                    if ((this->super_StaticRenderTest).m_w < 2) {
                                                      pcVar4 = "1 < m_w";
                                                    }
                                                    else if ((this->super_StaticRenderTest).m_h < y)
                                                    {
                                                      pcVar4 = "b-1 < m_h";
                                                    }
                                                    else {
                                                      vVar6 = rengine::StaticRenderTest::pixel
                                                                        (&this->
                                                  super_StaticRenderTest,1,y_00);
                                                  bVar1 = rengine::fuzzy_equals
                                                                    (vVar6,(vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40),0.01);
                                                  if (bVar1) {
                                                    if ((int)uVar5 <
                                                        (this->super_StaticRenderTest).m_w) {
                                                      if (y < (this->super_StaticRenderTest).m_h) {
                                                        vVar6 = rengine::StaticRenderTest::pixel
                                                                          (&this->
                                                  super_StaticRenderTest,uVar5,y);
                                                  b_01.z = 0.5;
                                                  b_01.w = 1.0;
                                                  b_01.x = 0.5;
                                                  b_01.y = 0.5;
                                                  bVar1 = rengine::fuzzy_equals(vVar6,b_01,0.01);
                                                  if (bVar1) {
                                                    if ((this->super_StaticRenderTest).m_w <
                                                        (int)uVar5) {
                                                      pcVar4 = "r-1 < m_w";
                                                    }
                                                    else if (y < (this->super_StaticRenderTest).m_h)
                                                    {
                                                      vVar6 = rengine::StaticRenderTest::pixel
                                                                        (&this->
                                                  super_StaticRenderTest,x,y);
                                                  bVar1 = rengine::fuzzy_equals
                                                                    (vVar6,(vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40),0.01);
                                                  if (bVar1) {
                                                    if ((int)uVar5 <
                                                        (this->super_StaticRenderTest).m_w) {
                                                      if ((this->super_StaticRenderTest).m_h < y) {
                                                        pcVar4 = "b-1 < m_h";
                                                      }
                                                      else {
                                                        vVar6 = rengine::StaticRenderTest::pixel
                                                                          (&this->
                                                  super_StaticRenderTest,uVar5,y_00);
                                                  bVar1 = rengine::fuzzy_equals
                                                                    (vVar6,(vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40),0.01);
                                                  if (bVar1) {
                                                    if ((this->super_StaticRenderTest).m_w <
                                                        (int)uVar5) {
                                                      pcVar4 = "r-1 < m_w";
                                                    }
                                                    else if ((this->super_StaticRenderTest).m_h < y)
                                                    {
                                                      pcVar4 = "b-1 < m_h";
                                                    }
                                                    else {
                                                      vVar6 = rengine::StaticRenderTest::pixel
                                                                        (&this->
                                                  super_StaticRenderTest,x,y_00);
                                                  bVar1 = rengine::fuzzy_equals
                                                                    (vVar6,(vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40),0.01);
                                                  if (bVar1) {
                                                    return;
                                                  }
                                                  poVar2 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,x);
                                                  poVar2 = std::operator<<(poVar2,",");
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,y_00);
                                                  poVar2 = std::operator<<(poVar2,")=");
                                                  poVar3 = (ostream *)(ulong)x;
                                                  vVar6 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,x
                                                                     ,y_00);
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               poVar3,vVar6);
                                                  pcVar4 = "; expected=";
                                                  poVar2 = std::operator<<(poVar2,"; expected=");
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               (ostream *)pcVar4,
                                                                               (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                                  std::endl<char,std::char_traits<char>>(poVar2);
                                                  pcVar4 = "false";
                                                  }
                                                  __assert_fail(pcVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x8c,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                                  }
                                                  poVar2 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,uVar5);
                                                  poVar2 = std::operator<<(poVar2,",");
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,y_00);
                                                  poVar2 = std::operator<<(poVar2,")=");
                                                  poVar3 = (ostream *)(ulong)uVar5;
                                                  vVar6 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,
                                                                     uVar5,y_00);
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               poVar3,vVar6);
                                                  pcVar4 = "; expected=";
                                                  poVar2 = std::operator<<(poVar2,"; expected=");
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               (ostream *)pcVar4,
                                                                               (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                                  std::endl<char,std::char_traits<char>>(poVar2);
                                                  pcVar4 = "false";
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "r < m_w";
                                                  }
                                                  __assert_fail(pcVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x8b,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                                  }
                                                  poVar2 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,x);
                                                  poVar2 = std::operator<<(poVar2,",");
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,y);
                                                  poVar2 = std::operator<<(poVar2,")=");
                                                  poVar3 = (ostream *)(ulong)x;
                                                  vVar6 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,x
                                                                     ,y);
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               poVar3,vVar6);
                                                  pcVar4 = "; expected=";
                                                  poVar2 = std::operator<<(poVar2,"; expected=");
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               (ostream *)pcVar4,
                                                                               (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                                  std::endl<char,std::char_traits<char>>(poVar2);
                                                  pcVar4 = "false";
                                                  }
                                                  else {
                                                    pcVar4 = "b < m_h";
                                                  }
                                                  __assert_fail(pcVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x8a,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                                  }
                                                  poVar2 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,uVar5);
                                                  poVar2 = std::operator<<(poVar2,",");
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,y);
                                                  poVar2 = std::operator<<(poVar2,")=");
                                                  poVar3 = (ostream *)(ulong)uVar5;
                                                  vVar6 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,
                                                                     uVar5,y);
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               poVar3,vVar6);
                                                  pcVar4 = "; expected=";
                                                  poVar2 = std::operator<<(poVar2,"; expected=");
                                                  v_00.z = 0.5;
                                                  v_00.w = 1.0;
                                                  v_00.x = 0.5;
                                                  v_00.y = 0.5;
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               (ostream *)pcVar4,
                                                                               v_00);
                                                  std::endl<char,std::char_traits<char>>(poVar2);
                                                  pcVar4 = "false";
                                                  }
                                                  else {
                                                    pcVar4 = "b < m_h";
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "r < m_w";
                                                  }
                                                  __assert_fail(pcVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x89,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                                  }
                                                  poVar2 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,1);
                                                  poVar2 = std::operator<<(poVar2,",");
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,y_00);
                                                  poVar2 = std::operator<<(poVar2,")=");
                                                  poVar3 = (ostream *)0x1;
                                                  vVar6 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,1
                                                                     ,y_00);
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               poVar3,vVar6);
                                                  pcVar4 = "; expected=";
                                                  poVar2 = std::operator<<(poVar2,"; expected=");
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               (ostream *)pcVar4,
                                                                               (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                                  std::endl<char,std::char_traits<char>>(poVar2);
                                                  pcVar4 = "false";
                                                  }
                                                  __assert_fail(pcVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x86,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                                  }
                                                  poVar2 = std::operator<<((ostream *)&std::cout,
                                                                           "pixels differ: (");
                                                  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 +
                                                                              -0x18) + 0x18) =
                                                       *(uint *)(poVar2 + *(long *)(*(long *)poVar2
                                                                                   + -0x18) + 0x18)
                                                       & 0xffffffb5 | 2;
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,0);
                                                  poVar2 = std::operator<<(poVar2,",");
                                                  poVar2 = (ostream *)
                                                           std::ostream::operator<<(poVar2,y_00);
                                                  poVar2 = std::operator<<(poVar2,")=");
                                                  poVar3 = (ostream *)0x0;
                                                  vVar6 = rengine::StaticRenderTest::pixel
                                                                    (&this->super_StaticRenderTest,0
                                                                     ,y_00);
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               poVar3,vVar6);
                                                  pcVar4 = "; expected=";
                                                  poVar2 = std::operator<<(poVar2,"; expected=");
                                                  poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                               (ostream *)pcVar4,
                                                                               (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                                  std::endl<char,std::char_traits<char>>(poVar2);
                                                  pcVar4 = "false";
                                                  }
                                                }
                                                __assert_fail(pcVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x85,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                              }
                                              poVar2 = std::operator<<((ostream *)&std::cout,
                                                                       "pixels differ: (");
                                              *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18)
                                                                 + 0x18) =
                                                   *(uint *)(poVar2 + *(long *)(*(long *)poVar2 +
                                                                               -0x18) + 0x18) &
                                                   0xffffffb5 | 2;
                                              poVar2 = (ostream *)std::ostream::operator<<(poVar2,1)
                                              ;
                                              poVar2 = std::operator<<(poVar2,",");
                                              poVar2 = (ostream *)std::ostream::operator<<(poVar2,y)
                                              ;
                                              poVar2 = std::operator<<(poVar2,")=");
                                              poVar3 = (ostream *)0x1;
                                              vVar6 = rengine::StaticRenderTest::pixel
                                                                (&this->super_StaticRenderTest,1,y);
                                              poVar2 = rengine::operator<<((rengine *)poVar2,poVar3,
                                                                           vVar6);
                                              pcVar4 = "; expected=";
                                              poVar2 = std::operator<<(poVar2,"; expected=");
                                              poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                           (ostream *)pcVar4,
                                                                           (vec4)(ZEXT816(
                                                  0x3f80000000000000) << 0x40));
                                              std::endl<char,std::char_traits<char>>(poVar2);
                                              pcVar4 = "false";
                                            }
                                            else {
                                              pcVar4 = "b < m_h";
                                            }
                                            __assert_fail(pcVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x84,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                          }
                                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                                   "pixels differ: (");
                                          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) +
                                                             0x18) =
                                               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18)
                                                                  + 0x18) & 0xffffffb5 | 2;
                                          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
                                          poVar2 = std::operator<<(poVar2,",");
                                          poVar2 = (ostream *)std::ostream::operator<<(poVar2,y);
                                          poVar2 = std::operator<<(poVar2,")=");
                                          poVar3 = (ostream *)0x0;
                                          vVar6 = rengine::StaticRenderTest::pixel
                                                            (&this->super_StaticRenderTest,0,y);
                                          poVar2 = rengine::operator<<((rengine *)poVar2,poVar3,
                                                                       vVar6);
                                          pcVar4 = "; expected=";
                                          poVar2 = std::operator<<(poVar2,"; expected=");
                                          poVar2 = rengine::operator<<((rengine *)poVar2,
                                                                       (ostream *)pcVar4,
                                                                       (vec4)(ZEXT816(
                                                  0x3f8000003f400000) << 0x40));
                                          std::endl<char,std::char_traits<char>>(poVar2);
                                          pcVar4 = "false";
                                        }
                                        else {
                                          pcVar4 = "b < m_h";
                                        }
                                      }
                                      __assert_fail(pcVar4,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                  ,0x83,
                                                  "virtual void TexturesOnViewportEdge::check()");
                                    }
                                    poVar2 = std::operator<<((ostream *)&std::cout,
                                                             "pixels differ: (");
                                    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                                         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) +
                                                            0x18) & 0xffffffb5 | 2;
                                    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x);
                                    poVar2 = std::operator<<(poVar2,",");
                                    poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
                                    poVar2 = std::operator<<(poVar2,")=");
                                    poVar3 = (ostream *)(ulong)x;
                                    vVar6 = rengine::StaticRenderTest::pixel
                                                      (&this->super_StaticRenderTest,x,1);
                                    poVar2 = rengine::operator<<((rengine *)poVar2,poVar3,vVar6);
                                    pcVar4 = "; expected=";
                                    poVar2 = std::operator<<(poVar2,"; expected=");
                                    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar4
                                                                 ,(vec4)(ZEXT816(0x3f80000000000000)
                                                                        << 0x40));
                                    std::endl<char,std::char_traits<char>>(poVar2);
                                    pcVar4 = "false";
                                  }
                                  __assert_fail(pcVar4,
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                                ,0x80,"virtual void TexturesOnViewportEdge::check()"
                                               );
                                }
                                poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                                *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                                     *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) &
                                     0xffffffb5 | 2;
                                poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar5);
                                poVar2 = std::operator<<(poVar2,",");
                                poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
                                poVar2 = std::operator<<(poVar2,")=");
                                poVar3 = (ostream *)(ulong)uVar5;
                                vVar6 = rengine::StaticRenderTest::pixel
                                                  (&this->super_StaticRenderTest,uVar5,1);
                                poVar2 = rengine::operator<<((rengine *)poVar2,poVar3,vVar6);
                                pcVar4 = "; expected=";
                                poVar2 = std::operator<<(poVar2,"; expected=");
                                poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar4,
                                                             (vec4)(ZEXT816(0x3f80000000000000) <<
                                                                   0x40));
                                std::endl<char,std::char_traits<char>>(poVar2);
                                pcVar4 = "false";
                              }
                            }
                            else {
                              pcVar4 = "r < m_w";
                            }
                            uVar5 = 0x7f;
                            goto LAB_0011c410;
                          }
                          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                          *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                               *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) &
                               0xffffffb5 | 2;
                          poVar2 = (ostream *)std::ostream::operator<<(poVar2,x);
                          poVar2 = std::operator<<(poVar2,",");
                          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
                          poVar2 = std::operator<<(poVar2,")=");
                          poVar3 = (ostream *)(ulong)x;
                          vVar6 = rengine::StaticRenderTest::pixel
                                            (&this->super_StaticRenderTest,x,0);
                          poVar2 = rengine::operator<<((rengine *)poVar2,poVar3,vVar6);
                          pcVar4 = "; expected=";
                          poVar2 = std::operator<<(poVar2,"; expected=");
                          poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar4,
                                                       (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
                          std::endl<char,std::char_traits<char>>(poVar2);
                          pcVar4 = "false";
                        }
                        uVar5 = 0x7e;
                        goto LAB_0011c410;
                      }
                      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) &
                           0xffffffb5 | 2;
                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar5);
                      poVar2 = std::operator<<(poVar2,",");
                      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
                      poVar2 = std::operator<<(poVar2,")=");
                      poVar3 = (ostream *)(ulong)uVar5;
                      vVar6 = rengine::StaticRenderTest::pixel
                                        (&this->super_StaticRenderTest,uVar5,0);
                      poVar2 = rengine::operator<<((rengine *)poVar2,poVar3,vVar6);
                      pcVar4 = "; expected=";
                      poVar2 = std::operator<<(poVar2,"; expected=");
                      v.z = 0.0;
                      v.w = 1.0;
                      v.x = 0.0;
                      v.y = 0.25;
                      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar4,v);
                      std::endl<char,std::char_traits<char>>(poVar2);
                      pcVar4 = "false";
                    }
                  }
                  else {
                    pcVar4 = "r < m_w";
                  }
                  uVar5 = 0x7d;
                  goto LAB_0011c410;
                }
                poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                     *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
                poVar2 = std::operator<<(poVar2,",");
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
                poVar2 = std::operator<<(poVar2,")=");
                poVar3 = (ostream *)0x0;
                vVar6 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,1);
                poVar2 = rengine::operator<<((rengine *)poVar2,poVar3,vVar6);
                pcVar4 = "; expected=";
                poVar2 = std::operator<<(poVar2,"; expected=");
                poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar4,
                                             (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
                std::endl<char,std::char_traits<char>>(poVar2);
                pcVar4 = "false";
              }
              uVar5 = 0x7a;
              goto LAB_0011c410;
            }
            poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
            *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
            poVar2 = std::operator<<(poVar2,",");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
            poVar2 = std::operator<<(poVar2,")=");
            poVar3 = (ostream *)0x1;
            vVar6 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,1);
            poVar2 = rengine::operator<<((rengine *)poVar2,poVar3,vVar6);
            pcVar4 = "; expected=";
            poVar2 = std::operator<<(poVar2,"; expected=");
            poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar4,
                                         (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
            std::endl<char,std::char_traits<char>>(poVar2);
            pcVar4 = "false";
          }
          uVar5 = 0x79;
          goto LAB_0011c410;
        }
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
             *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
        poVar2 = std::operator<<(poVar2,")=");
        poVar3 = (ostream *)0x1;
        vVar6 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,1,0);
        poVar2 = rengine::operator<<((rengine *)poVar2,poVar3,vVar6);
        pcVar4 = "; expected=";
        poVar2 = std::operator<<(poVar2,"; expected=");
        poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar4,
                                     (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
        std::endl<char,std::char_traits<char>>(poVar2);
        pcVar4 = "false";
      }
      uVar5 = 0x78;
      goto LAB_0011c410;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar3 = (ostream *)0x0;
    vVar6 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0,0);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar3,vVar6);
    pcVar4 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    vVar6.z = 0.0;
    vVar6.w = 1.0;
    vVar6.x = 0.5;
    vVar6.y = 0.0;
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar4,vVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar4 = "false";
  }
  uVar5 = 0x77;
LAB_0011c410:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                ,uVar5,"virtual void TexturesOnViewportEdge::check()");
}

Assistant:

void check() override {
        vec2 s = surface()->size();

        int r = s.x - 1;
        int b = s.y - 1;

        // Top/left 50% red
        check_pixel(0, 0, vec4(0.5, 0, 0, 1));
        check_pixel(1, 0, vec4(0.0, 0, 0, 1));
        check_pixel(1, 1, vec4(0.0, 0, 0, 1));
        check_pixel(0, 1, vec4(0.0, 0, 0, 1));

        // Top/right 25% green
        check_pixel(r,   0, vec4(0, 0.25, 0, 1));
        check_pixel(r-1, 0, vec4(0.0, 0, 0, 1));
        check_pixel(r,   1, vec4(0.0, 0, 0, 1));
        check_pixel(r-1, 1, vec4(0.0, 0, 0, 1));

        // Bottom/left 75% blue
        check_pixel(0, b,   vec4(0, 0, 0.75, 1));
        check_pixel(1, b,   vec4(0, 0, 0, 1));
        check_pixel(0, b-1, vec4(0, 0, 0, 1));
        check_pixel(1, b-1, vec4(0, 0, 0, 1));

        // Top/right 50% white
        check_pixel(r, b,  vec4(0.5, 0.5, 0.5, 1));
        check_pixel(r-1, b, vec4(0, 0, 0, 1));
        check_pixel(r, b-1, vec4(0, 0, 0, 1));
        check_pixel(r-1, b-1, vec4(0, 0, 0, 1));
    }